

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  StackItemT<embree::NodeRefPtr<4>_> SVar21;
  StackItemT<embree::NodeRefPtr<4>_> SVar22;
  StackItemT<embree::NodeRefPtr<4>_> SVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  int iVar29;
  long lVar30;
  RTCRayN *pRVar31;
  undefined4 uVar32;
  ulong unaff_RBP;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar37;
  long lVar38;
  ulong uVar39;
  size_t sVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 extraout_var [56];
  float fVar58;
  float fVar69;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar70;
  float fVar82;
  float fVar84;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar86;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar83;
  float fVar85;
  float fVar87;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar88;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [16];
  float fVar103;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [64];
  float fVar119;
  undefined1 auVar120 [16];
  float fVar130;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar127 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [64];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar141 [64];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  float fVar152;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar149 [16];
  float fVar151;
  float fVar153;
  undefined1 auVar150 [64];
  float fVar157;
  undefined1 auVar158 [16];
  float fVar163;
  undefined1 auVar159 [16];
  float fVar161;
  float fVar162;
  undefined1 auVar160 [64];
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar165 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 *local_1268;
  ulong local_1260;
  ulong local_1258;
  ulong local_1250;
  RTCFilterFunctionNArguments args;
  undefined8 local_1208;
  undefined8 uStack_1200;
  vfloat<4> tNear;
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1098;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar37 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_10c8._4_4_ = uVar32;
  local_10c8._0_4_ = uVar32;
  local_10c8._8_4_ = uVar32;
  local_10c8._12_4_ = uVar32;
  auVar118 = ZEXT1664(local_10c8);
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_10d8._4_4_ = uVar32;
  local_10d8._0_4_ = uVar32;
  local_10d8._8_4_ = uVar32;
  local_10d8._12_4_ = uVar32;
  auVar127 = ZEXT1664(local_10d8);
  uVar32 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_10e8._4_4_ = uVar32;
  local_10e8._0_4_ = uVar32;
  local_10e8._8_4_ = uVar32;
  local_10e8._12_4_ = uVar32;
  auVar134 = ZEXT1664(local_10e8);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar92 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar41 = ZEXT416((uint)(fVar88 * 0.99999964));
  local_10f8 = vshufps_avx(auVar41,auVar41,0);
  auVar136 = ZEXT1664(local_10f8);
  auVar41 = ZEXT416((uint)(fVar91 * 0.99999964));
  local_1108 = vshufps_avx(auVar41,auVar41,0);
  auVar141 = ZEXT1664(local_1108);
  auVar41 = ZEXT416((uint)(fVar92 * 0.99999964));
  local_1118 = vshufps_avx(auVar41,auVar41,0);
  auVar145 = ZEXT1664(local_1118);
  auVar41 = ZEXT416((uint)(fVar88 * 1.0000004));
  local_1128 = vshufps_avx(auVar41,auVar41,0);
  auVar150 = ZEXT1664(local_1128);
  auVar41 = ZEXT416((uint)(fVar91 * 1.0000004));
  local_1138 = vshufps_avx(auVar41,auVar41,0);
  auVar160 = ZEXT1664(local_1138);
  auVar41 = ZEXT416((uint)(fVar92 * 1.0000004));
  local_1148 = vshufps_avx(auVar41,auVar41,0);
  auVar165 = ZEXT1664(local_1148);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1260 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1250 = local_1260 ^ 0x10;
  local_1258 = uVar33 ^ 0x10;
  iVar29 = (tray->tnear).field_0.i[k];
  auVar41._4_4_ = iVar29;
  auVar41._0_4_ = iVar29;
  auVar41._8_4_ = iVar29;
  auVar41._12_4_ = iVar29;
  iVar29 = (tray->tfar).field_0.i[k];
  auVar47 = ZEXT1664(CONCAT412(iVar29,CONCAT48(iVar29,CONCAT44(iVar29,iVar29))));
  local_1268 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar35 = local_1260;
  do {
    do {
      do {
        if (pSVar37 == stack) {
          return;
        }
        pSVar28 = pSVar37 + -1;
        pSVar37 = pSVar37 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar28->dist);
      sVar40 = (pSVar37->ptr).ptr;
      do {
        if ((sVar40 & 8) == 0) {
          auVar49 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + uVar36),auVar118._0_16_);
          auVar48._0_4_ = auVar136._0_4_ * auVar49._0_4_;
          auVar48._4_4_ = auVar136._4_4_ * auVar49._4_4_;
          auVar48._8_4_ = auVar136._8_4_ * auVar49._8_4_;
          auVar48._12_4_ = auVar136._12_4_ * auVar49._12_4_;
          auVar49 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + uVar35),auVar127._0_16_);
          auVar59._0_4_ = auVar141._0_4_ * auVar49._0_4_;
          auVar59._4_4_ = auVar141._4_4_ * auVar49._4_4_;
          auVar59._8_4_ = auVar141._8_4_ * auVar49._8_4_;
          auVar59._12_4_ = auVar141._12_4_ * auVar49._12_4_;
          auVar49 = vmaxps_avx(auVar48,auVar59);
          auVar48 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + uVar33),auVar134._0_16_);
          auVar60._0_4_ = auVar145._0_4_ * auVar48._0_4_;
          auVar60._4_4_ = auVar145._4_4_ * auVar48._4_4_;
          auVar60._8_4_ = auVar145._8_4_ * auVar48._8_4_;
          auVar60._12_4_ = auVar145._12_4_ * auVar48._12_4_;
          auVar48 = vmaxps_avx(auVar60,auVar41);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar49,auVar48)
          ;
          auVar49 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + (uVar36 ^ 0x10)),
                               auVar118._0_16_);
          auVar61._0_4_ = auVar150._0_4_ * auVar49._0_4_;
          auVar61._4_4_ = auVar150._4_4_ * auVar49._4_4_;
          auVar61._8_4_ = auVar150._8_4_ * auVar49._8_4_;
          auVar61._12_4_ = auVar150._12_4_ * auVar49._12_4_;
          auVar49 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + local_1250),auVar127._0_16_);
          auVar71._0_4_ = auVar160._0_4_ * auVar49._0_4_;
          auVar71._4_4_ = auVar160._4_4_ * auVar49._4_4_;
          auVar71._8_4_ = auVar160._8_4_ * auVar49._8_4_;
          auVar71._12_4_ = auVar160._12_4_ * auVar49._12_4_;
          auVar49 = vminps_avx(auVar61,auVar71);
          auVar48 = vsubps_avx(*(undefined1 (*) [16])(sVar40 + 0x20 + local_1258),auVar134._0_16_);
          auVar72._0_4_ = auVar165._0_4_ * auVar48._0_4_;
          auVar72._4_4_ = auVar165._4_4_ * auVar48._4_4_;
          auVar72._8_4_ = auVar165._8_4_ * auVar48._8_4_;
          auVar72._12_4_ = auVar165._12_4_ * auVar48._12_4_;
          auVar48 = vminps_avx(auVar72,auVar47._0_16_);
          auVar49 = vminps_avx(auVar49,auVar48);
          auVar49 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar49,2);
          uVar32 = vmovmskps_avx(auVar49);
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar32);
        }
        if ((sVar40 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar29 = 4;
          }
          else {
            uVar39 = sVar40 & 0xfffffffffffffff0;
            lVar38 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
              }
            }
            iVar29 = 0;
            sVar40 = *(ulong *)(uVar39 + lVar38 * 8);
            uVar34 = unaff_RBP - 1 & unaff_RBP;
            if (uVar34 != 0) {
              uVar4 = tNear.field_0.i[lVar38];
              lVar38 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                }
              }
              uVar5 = *(ulong *)(uVar39 + lVar38 * 8);
              uVar3 = tNear.field_0.i[lVar38];
              uVar34 = uVar34 - 1 & uVar34;
              if (uVar34 == 0) {
                if (uVar4 < uVar3) {
                  (pSVar37->ptr).ptr = uVar5;
                  pSVar37->dist = uVar3;
                  pSVar37 = pSVar37 + 1;
                }
                else {
                  (pSVar37->ptr).ptr = sVar40;
                  pSVar37->dist = uVar4;
                  pSVar37 = pSVar37 + 1;
                  sVar40 = uVar5;
                }
              }
              else {
                auVar49._8_8_ = 0;
                auVar49._0_8_ = sVar40;
                auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar4));
                auVar62._8_8_ = 0;
                auVar62._0_8_ = uVar5;
                auVar48 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar3));
                lVar38 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                  }
                }
                auVar73._8_8_ = 0;
                auVar73._0_8_ = *(ulong *)(uVar39 + lVar38 * 8);
                auVar60 = vpunpcklqdq_avx(auVar73,ZEXT416((uint)tNear.field_0.i[lVar38]));
                auVar59 = vpcmpgtd_avx(auVar48,auVar49);
                uVar34 = uVar34 - 1 & uVar34;
                if (uVar34 == 0) {
                  auVar61 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar48,auVar49,auVar61);
                  auVar49 = vblendvps_avx(auVar49,auVar48,auVar61);
                  auVar48 = vpcmpgtd_avx(auVar60,auVar59);
                  auVar61 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar60,auVar59,auVar61);
                  auVar59 = vblendvps_avx(auVar59,auVar60,auVar61);
                  auVar60 = vpcmpgtd_avx(auVar59,auVar49);
                  auVar60 = vpshufd_avx(auVar60,0xaa);
                  SVar21 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar59,auVar49,auVar60);
                  SVar22 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar49,auVar59,auVar60);
                  *pSVar37 = SVar22;
                  pSVar37[1] = SVar21;
                  sVar40 = auVar48._0_8_;
                  pSVar37 = pSVar37 + 2;
                }
                else {
                  lVar38 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                    }
                  }
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = *(ulong *)(uVar39 + lVar38 * 8);
                  auVar71 = vpunpcklqdq_avx(auVar96,ZEXT416((uint)tNear.field_0.i[lVar38]));
                  auVar61 = vpshufd_avx(auVar59,0xaa);
                  auVar59 = vblendvps_avx(auVar48,auVar49,auVar61);
                  auVar49 = vblendvps_avx(auVar49,auVar48,auVar61);
                  auVar48 = vpcmpgtd_avx(auVar71,auVar60);
                  auVar61 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar71,auVar60,auVar61);
                  auVar60 = vblendvps_avx(auVar60,auVar71,auVar61);
                  auVar61 = vpcmpgtd_avx(auVar60,auVar49);
                  auVar71 = vpshufd_avx(auVar61,0xaa);
                  auVar61 = vblendvps_avx(auVar60,auVar49,auVar71);
                  SVar21 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar49,auVar60,auVar71);
                  auVar49 = vpcmpgtd_avx(auVar48,auVar59);
                  auVar60 = vpshufd_avx(auVar49,0xaa);
                  auVar49 = vblendvps_avx(auVar48,auVar59,auVar60);
                  auVar48 = vblendvps_avx(auVar59,auVar48,auVar60);
                  auVar59 = vpcmpgtd_avx(auVar61,auVar48);
                  auVar59 = vpshufd_avx(auVar59,0xaa);
                  SVar22 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar61,auVar48,auVar59);
                  SVar23 = (StackItemT<embree::NodeRefPtr<4>_>)
                           vblendvps_avx(auVar48,auVar61,auVar59);
                  *pSVar37 = SVar21;
                  pSVar37[1] = SVar23;
                  pSVar37[2] = SVar22;
                  sVar40 = auVar49._0_8_;
                  pSVar37 = pSVar37 + 3;
                }
              }
            }
          }
        }
        else {
          iVar29 = 6;
        }
      } while (iVar29 == 0);
    } while (iVar29 != 6);
    uVar35 = (ulong)((uint)sVar40 & 0xf);
    if (uVar35 != 8) {
      uVar39 = sVar40 & 0xfffffffffffffff0;
      lVar38 = 0;
      do {
        lVar30 = lVar38 * 0x50;
        pSVar6 = context->scene;
        ppfVar7 = (pSVar6->vertices).items;
        pfVar8 = ppfVar7[*(uint *)(uVar39 + 0x30 + lVar30)];
        pfVar9 = ppfVar7[*(uint *)(uVar39 + 0x34 + lVar30)];
        pfVar10 = ppfVar7[*(uint *)(uVar39 + 0x38 + lVar30)];
        pfVar11 = ppfVar7[*(uint *)(uVar39 + 0x3c + lVar30)];
        auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + lVar30)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + 8 + lVar30)));
        auVar49 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + lVar30)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + 8 + lVar30)));
        auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar39 + 4 + lVar30)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 0xc + lVar30)));
        auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar39 + 4 + lVar30)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 0xc + lVar30)));
        auVar71 = vunpcklps_avx(auVar49,auVar48);
        auVar72 = vunpcklps_avx(auVar59,auVar60);
        auVar49 = vunpckhps_avx(auVar59,auVar60);
        auVar60 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x10 + lVar30)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + 0x18 + lVar30)))
        ;
        auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x10 + lVar30)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + 0x18 + lVar30)))
        ;
        auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar39 + 0x14 + lVar30)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 0x1c + lVar30)))
        ;
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar39 + 0x14 + lVar30)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 0x1c + lVar30)))
        ;
        auVar62 = vunpcklps_avx(auVar48,auVar59);
        auVar73 = vunpcklps_avx(auVar60,auVar61);
        auVar48 = vunpckhps_avx(auVar60,auVar61);
        auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x20 + lVar30)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + 0x28 + lVar30)))
        ;
        auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar39 + 0x20 + lVar30)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar39 + 0x28 + lVar30)))
        ;
        auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar39 + 0x24 + lVar30)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 0x2c + lVar30)))
        ;
        auVar60 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar39 + 0x24 + lVar30)),
                                *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar39 + 0x2c + lVar30)))
        ;
        auVar63 = vunpcklps_avx(auVar59,auVar60);
        auVar60 = vunpcklps_avx(auVar61,auVar96);
        auVar61 = vunpckhps_avx(auVar61,auVar96);
        puVar1 = (undefined8 *)(uVar39 + 0x30 + lVar30);
        local_1018 = *puVar1;
        uStack_1010 = puVar1[1];
        puVar1 = (undefined8 *)(uVar39 + 0x40 + lVar30);
        local_1208 = *puVar1;
        uStack_1200 = puVar1[1];
        uVar32 = *(undefined4 *)(ray + k * 4);
        auVar131._4_4_ = uVar32;
        auVar131._0_4_ = uVar32;
        auVar131._8_4_ = uVar32;
        auVar131._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar148._4_4_ = uVar32;
        auVar148._0_4_ = uVar32;
        auVar148._8_4_ = uVar32;
        auVar148._12_4_ = uVar32;
        uVar32 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar158._4_4_ = uVar32;
        auVar158._0_4_ = uVar32;
        auVar158._8_4_ = uVar32;
        auVar158._12_4_ = uVar32;
        local_1028 = vsubps_avx(auVar72,auVar131);
        local_1038 = vsubps_avx(auVar49,auVar148);
        local_1048 = vsubps_avx(auVar71,auVar158);
        auVar49 = vsubps_avx(auVar73,auVar131);
        auVar48 = vsubps_avx(auVar48,auVar148);
        auVar59 = vsubps_avx(auVar62,auVar158);
        auVar60 = vsubps_avx(auVar60,auVar131);
        auVar61 = vsubps_avx(auVar61,auVar148);
        auVar71 = vsubps_avx(auVar63,auVar158);
        local_1058 = vsubps_avx(auVar60,local_1028);
        local_1068 = vsubps_avx(auVar61,local_1038);
        local_1078 = vsubps_avx(auVar71,local_1048);
        fVar13 = local_1038._0_4_;
        fVar88 = auVar61._0_4_ + fVar13;
        fVar85 = local_1038._4_4_;
        fVar91 = auVar61._4_4_ + fVar85;
        fVar15 = local_1038._8_4_;
        fVar92 = auVar61._8_4_ + fVar15;
        fVar18 = local_1038._12_4_;
        fVar93 = auVar61._12_4_ + fVar18;
        fVar70 = local_1048._0_4_;
        fVar94 = auVar71._0_4_ + fVar70;
        fVar87 = local_1048._4_4_;
        fVar101 = auVar71._4_4_ + fVar87;
        fVar16 = local_1048._8_4_;
        fVar102 = auVar71._8_4_ + fVar16;
        fVar19 = local_1048._12_4_;
        fVar103 = auVar71._12_4_ + fVar19;
        fVar58 = local_1078._0_4_;
        auVar120._0_4_ = fVar88 * fVar58;
        fVar69 = local_1078._4_4_;
        auVar120._4_4_ = fVar91 * fVar69;
        fVar24 = local_1078._8_4_;
        auVar120._8_4_ = fVar92 * fVar24;
        fVar25 = local_1078._12_4_;
        auVar120._12_4_ = fVar93 * fVar25;
        fVar164 = local_1068._0_4_;
        auVar132._0_4_ = fVar164 * fVar94;
        fVar166 = local_1068._4_4_;
        auVar132._4_4_ = fVar166 * fVar101;
        fVar167 = local_1068._8_4_;
        auVar132._8_4_ = fVar167 * fVar102;
        fVar168 = local_1068._12_4_;
        auVar132._12_4_ = fVar168 * fVar103;
        auVar72 = vsubps_avx(auVar132,auVar120);
        fVar83 = local_1028._0_4_;
        fVar119 = auVar60._0_4_ + fVar83;
        fVar14 = local_1028._4_4_;
        fVar128 = auVar60._4_4_ + fVar14;
        fVar17 = local_1028._8_4_;
        fVar129 = auVar60._8_4_ + fVar17;
        fVar20 = local_1028._12_4_;
        fVar130 = auVar60._12_4_ + fVar20;
        fVar157 = local_1058._0_4_;
        auVar97._0_4_ = fVar157 * fVar94;
        fVar161 = local_1058._4_4_;
        auVar97._4_4_ = fVar161 * fVar101;
        fVar162 = local_1058._8_4_;
        auVar97._8_4_ = fVar162 * fVar102;
        fVar163 = local_1058._12_4_;
        auVar97._12_4_ = fVar163 * fVar103;
        auVar133._0_4_ = fVar119 * fVar58;
        auVar133._4_4_ = fVar128 * fVar69;
        auVar133._8_4_ = fVar129 * fVar24;
        auVar133._12_4_ = fVar130 * fVar25;
        auVar62 = vsubps_avx(auVar133,auVar97);
        auVar121._0_4_ = fVar119 * fVar164;
        auVar121._4_4_ = fVar128 * fVar166;
        auVar121._8_4_ = fVar129 * fVar167;
        auVar121._12_4_ = fVar130 * fVar168;
        auVar89._0_4_ = fVar157 * fVar88;
        auVar89._4_4_ = fVar161 * fVar91;
        auVar89._8_4_ = fVar162 * fVar92;
        auVar89._12_4_ = fVar163 * fVar93;
        auVar73 = vsubps_avx(auVar89,auVar121);
        fVar88 = *(float *)(ray + k * 4 + 0x60);
        fVar91 = *(float *)(ray + k * 4 + 0x50);
        fVar92 = *(float *)(ray + k * 4 + 0x40);
        local_1098._0_4_ = fVar92 * auVar72._0_4_ + auVar73._0_4_ * fVar88 + fVar91 * auVar62._0_4_;
        local_1098._4_4_ = fVar92 * auVar72._4_4_ + auVar73._4_4_ * fVar88 + fVar91 * auVar62._4_4_;
        local_1098._8_4_ = fVar92 * auVar72._8_4_ + auVar73._8_4_ * fVar88 + fVar91 * auVar62._8_4_;
        local_1098._12_4_ =
             fVar92 * auVar72._12_4_ + auVar73._12_4_ * fVar88 + fVar91 * auVar62._12_4_;
        local_1088 = vsubps_avx(local_1038,auVar48);
        auVar72 = vsubps_avx(local_1048,auVar59);
        fVar93 = auVar48._0_4_ + fVar13;
        fVar94 = auVar48._4_4_ + fVar85;
        fVar101 = auVar48._8_4_ + fVar15;
        fVar102 = auVar48._12_4_ + fVar18;
        fVar103 = auVar59._0_4_ + fVar70;
        fVar119 = auVar59._4_4_ + fVar87;
        fVar128 = auVar59._8_4_ + fVar16;
        fVar129 = auVar59._12_4_ + fVar19;
        fVar140 = auVar72._0_4_;
        auVar159._0_4_ = fVar140 * fVar93;
        fVar142 = auVar72._4_4_;
        auVar159._4_4_ = fVar142 * fVar94;
        fVar143 = auVar72._8_4_;
        auVar159._8_4_ = fVar143 * fVar101;
        fVar144 = auVar72._12_4_;
        auVar159._12_4_ = fVar144 * fVar102;
        fVar146 = local_1088._0_4_;
        auVar74._0_4_ = fVar146 * fVar103;
        fVar151 = local_1088._4_4_;
        auVar74._4_4_ = fVar151 * fVar119;
        fVar153 = local_1088._8_4_;
        auVar74._8_4_ = fVar153 * fVar128;
        fVar155 = local_1088._12_4_;
        auVar74._12_4_ = fVar155 * fVar129;
        auVar72 = vsubps_avx(auVar74,auVar159);
        auVar62 = vsubps_avx(local_1028,auVar49);
        fVar135 = auVar62._0_4_;
        auVar98._0_4_ = fVar135 * fVar103;
        fVar137 = auVar62._4_4_;
        auVar98._4_4_ = fVar137 * fVar119;
        fVar138 = auVar62._8_4_;
        auVar98._8_4_ = fVar138 * fVar128;
        fVar139 = auVar62._12_4_;
        auVar98._12_4_ = fVar139 * fVar129;
        fVar103 = auVar49._0_4_ + fVar83;
        fVar119 = auVar49._4_4_ + fVar14;
        fVar128 = auVar49._8_4_ + fVar17;
        fVar129 = auVar49._12_4_ + fVar20;
        auVar122._0_4_ = fVar140 * fVar103;
        auVar122._4_4_ = fVar142 * fVar119;
        auVar122._8_4_ = fVar143 * fVar128;
        auVar122._12_4_ = fVar144 * fVar129;
        auVar62 = vsubps_avx(auVar122,auVar98);
        auVar112._0_4_ = fVar146 * fVar103;
        auVar112._4_4_ = fVar151 * fVar119;
        auVar112._8_4_ = fVar153 * fVar128;
        auVar112._12_4_ = fVar155 * fVar129;
        auVar90._0_4_ = fVar135 * fVar93;
        auVar90._4_4_ = fVar137 * fVar94;
        auVar90._8_4_ = fVar138 * fVar101;
        auVar90._12_4_ = fVar139 * fVar102;
        auVar73 = vsubps_avx(auVar90,auVar112);
        local_10a8._0_4_ = fVar92 * auVar72._0_4_ + auVar73._0_4_ * fVar88 + fVar91 * auVar62._0_4_;
        local_10a8._4_4_ = fVar92 * auVar72._4_4_ + auVar73._4_4_ * fVar88 + fVar91 * auVar62._4_4_;
        local_10a8._8_4_ = fVar92 * auVar72._8_4_ + auVar73._8_4_ * fVar88 + fVar91 * auVar62._8_4_;
        local_10a8._12_4_ =
             fVar92 * auVar72._12_4_ + auVar73._12_4_ * fVar88 + fVar91 * auVar62._12_4_;
        auVar72 = vsubps_avx(auVar49,auVar60);
        fVar103 = auVar49._0_4_ + auVar60._0_4_;
        fVar119 = auVar49._4_4_ + auVar60._4_4_;
        fVar128 = auVar49._8_4_ + auVar60._8_4_;
        fVar129 = auVar49._12_4_ + auVar60._12_4_;
        auVar49 = vsubps_avx(auVar48,auVar61);
        fVar130 = auVar48._0_4_ + auVar61._0_4_;
        fVar82 = auVar48._4_4_ + auVar61._4_4_;
        fVar84 = auVar48._8_4_ + auVar61._8_4_;
        fVar86 = auVar48._12_4_ + auVar61._12_4_;
        auVar48 = vsubps_avx(auVar59,auVar71);
        fVar104 = auVar59._0_4_ + auVar71._0_4_;
        fVar109 = auVar59._4_4_ + auVar71._4_4_;
        fVar110 = auVar59._8_4_ + auVar71._8_4_;
        fVar111 = auVar59._12_4_ + auVar71._12_4_;
        fVar93 = auVar48._0_4_;
        auVar113._0_4_ = fVar130 * fVar93;
        fVar94 = auVar48._4_4_;
        auVar113._4_4_ = fVar82 * fVar94;
        fVar101 = auVar48._8_4_;
        auVar113._8_4_ = fVar84 * fVar101;
        fVar102 = auVar48._12_4_;
        auVar113._12_4_ = fVar86 * fVar102;
        fVar147 = auVar49._0_4_;
        auVar123._0_4_ = fVar147 * fVar104;
        fVar152 = auVar49._4_4_;
        auVar123._4_4_ = fVar152 * fVar109;
        fVar154 = auVar49._8_4_;
        auVar123._8_4_ = fVar154 * fVar110;
        fVar156 = auVar49._12_4_;
        auVar123._12_4_ = fVar156 * fVar111;
        auVar49 = vsubps_avx(auVar123,auVar113);
        fVar95 = auVar72._0_4_;
        auVar105._0_4_ = fVar95 * fVar104;
        fVar104 = auVar72._4_4_;
        auVar105._4_4_ = fVar104 * fVar109;
        fVar109 = auVar72._8_4_;
        auVar105._8_4_ = fVar109 * fVar110;
        fVar110 = auVar72._12_4_;
        auVar105._12_4_ = fVar110 * fVar111;
        auVar124._0_4_ = fVar103 * fVar93;
        auVar124._4_4_ = fVar119 * fVar94;
        auVar124._8_4_ = fVar128 * fVar101;
        auVar124._12_4_ = fVar129 * fVar102;
        auVar48 = vsubps_avx(auVar124,auVar105);
        auVar63._0_4_ = fVar147 * fVar103;
        auVar63._4_4_ = fVar152 * fVar119;
        auVar63._8_4_ = fVar154 * fVar128;
        auVar63._12_4_ = fVar156 * fVar129;
        auVar75._0_4_ = fVar95 * fVar130;
        auVar75._4_4_ = fVar104 * fVar82;
        auVar75._8_4_ = fVar109 * fVar84;
        auVar75._12_4_ = fVar110 * fVar86;
        auVar59 = vsubps_avx(auVar75,auVar63);
        auVar64._0_4_ = fVar92 * auVar49._0_4_ + auVar59._0_4_ * fVar88 + fVar91 * auVar48._0_4_;
        auVar64._4_4_ = fVar92 * auVar49._4_4_ + auVar59._4_4_ * fVar88 + fVar91 * auVar48._4_4_;
        auVar64._8_4_ = fVar92 * auVar49._8_4_ + auVar59._8_4_ * fVar88 + fVar91 * auVar48._8_4_;
        auVar64._12_4_ = fVar92 * auVar49._12_4_ + auVar59._12_4_ * fVar88 + fVar91 * auVar48._12_4_
        ;
        auVar149._0_4_ = auVar64._0_4_ + local_1098._0_4_ + local_10a8._0_4_;
        auVar149._4_4_ = auVar64._4_4_ + local_1098._4_4_ + local_10a8._4_4_;
        auVar149._8_4_ = auVar64._8_4_ + local_1098._8_4_ + local_10a8._8_4_;
        auVar149._12_4_ = auVar64._12_4_ + local_1098._12_4_ + local_10a8._12_4_;
        auVar49 = vminps_avx((undefined1  [16])local_1098,local_10a8);
        auVar49 = vminps_avx(auVar49,auVar64);
        auVar106._8_4_ = 0x7fffffff;
        auVar106._0_8_ = 0x7fffffff7fffffff;
        auVar106._12_4_ = 0x7fffffff;
        local_10b8 = vandps_avx(auVar149,auVar106);
        auVar107._0_4_ = local_10b8._0_4_ * 1.1920929e-07;
        auVar107._4_4_ = local_10b8._4_4_ * 1.1920929e-07;
        auVar107._8_4_ = local_10b8._8_4_ * 1.1920929e-07;
        auVar107._12_4_ = local_10b8._12_4_ * 1.1920929e-07;
        uVar34 = CONCAT44(auVar107._4_4_,auVar107._0_4_);
        auVar114._0_8_ = uVar34 ^ 0x8000000080000000;
        auVar114._8_4_ = -auVar107._8_4_;
        auVar114._12_4_ = -auVar107._12_4_;
        auVar49 = vcmpps_avx(auVar49,auVar114,5);
        auVar48 = vmaxps_avx((undefined1  [16])local_1098,local_10a8);
        auVar48 = vmaxps_avx(auVar48,auVar64);
        auVar48 = vcmpps_avx(auVar48,auVar107,2);
        auVar49 = vorps_avx(auVar49,auVar48);
        if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar49 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar49 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar49[0xf] < '\0') {
          auVar65._0_4_ = fVar58 * fVar146;
          auVar65._4_4_ = fVar69 * fVar151;
          auVar65._8_4_ = fVar24 * fVar153;
          auVar65._12_4_ = fVar25 * fVar155;
          auVar76._0_4_ = fVar164 * fVar140;
          auVar76._4_4_ = fVar166 * fVar142;
          auVar76._8_4_ = fVar167 * fVar143;
          auVar76._12_4_ = fVar168 * fVar144;
          auVar60 = vsubps_avx(auVar76,auVar65);
          auVar108._0_4_ = fVar147 * fVar140;
          auVar108._4_4_ = fVar152 * fVar142;
          auVar108._8_4_ = fVar154 * fVar143;
          auVar108._12_4_ = fVar156 * fVar144;
          auVar115._0_4_ = fVar146 * fVar93;
          auVar115._4_4_ = fVar151 * fVar94;
          auVar115._8_4_ = fVar153 * fVar101;
          auVar115._12_4_ = fVar155 * fVar102;
          auVar61 = vsubps_avx(auVar115,auVar108);
          auVar125._8_4_ = 0x7fffffff;
          auVar125._0_8_ = 0x7fffffff7fffffff;
          auVar125._12_4_ = 0x7fffffff;
          auVar48 = vandps_avx(auVar125,auVar65);
          auVar59 = vandps_avx(auVar125,auVar108);
          auVar48 = vcmpps_avx(auVar48,auVar59,1);
          local_1178 = vblendvps_avx(auVar61,auVar60,auVar48);
          auVar50._0_4_ = fVar135 * fVar93;
          auVar50._4_4_ = fVar137 * fVar94;
          auVar50._8_4_ = fVar138 * fVar101;
          auVar50._12_4_ = fVar139 * fVar102;
          auVar66._0_4_ = fVar135 * fVar58;
          auVar66._4_4_ = fVar137 * fVar69;
          auVar66._8_4_ = fVar138 * fVar24;
          auVar66._12_4_ = fVar139 * fVar25;
          auVar77._0_4_ = fVar157 * fVar140;
          auVar77._4_4_ = fVar161 * fVar142;
          auVar77._8_4_ = fVar162 * fVar143;
          auVar77._12_4_ = fVar163 * fVar144;
          auVar60 = vsubps_avx(auVar66,auVar77);
          auVar116._0_4_ = fVar140 * fVar95;
          auVar116._4_4_ = fVar142 * fVar104;
          auVar116._8_4_ = fVar143 * fVar109;
          auVar116._12_4_ = fVar144 * fVar110;
          auVar61 = vsubps_avx(auVar116,auVar50);
          auVar48 = vandps_avx(auVar125,auVar77);
          auVar59 = vandps_avx(auVar125,auVar50);
          auVar48 = vcmpps_avx(auVar48,auVar59,1);
          local_1168 = vblendvps_avx(auVar61,auVar60,auVar48);
          auVar67._0_4_ = fVar95 * fVar146;
          auVar67._4_4_ = fVar104 * fVar151;
          auVar67._8_4_ = fVar109 * fVar153;
          auVar67._12_4_ = fVar110 * fVar155;
          auVar78._0_4_ = fVar157 * fVar146;
          auVar78._4_4_ = fVar161 * fVar151;
          auVar78._8_4_ = fVar162 * fVar153;
          auVar78._12_4_ = fVar163 * fVar155;
          auVar99._0_4_ = fVar135 * fVar164;
          auVar99._4_4_ = fVar137 * fVar166;
          auVar99._8_4_ = fVar138 * fVar167;
          auVar99._12_4_ = fVar139 * fVar168;
          auVar42._0_4_ = fVar135 * fVar147;
          auVar42._4_4_ = fVar137 * fVar152;
          auVar42._8_4_ = fVar138 * fVar154;
          auVar42._12_4_ = fVar139 * fVar156;
          auVar60 = vsubps_avx(auVar78,auVar99);
          auVar61 = vsubps_avx(auVar42,auVar67);
          auVar48 = vandps_avx(auVar125,auVar99);
          auVar59 = vandps_avx(auVar125,auVar67);
          auVar48 = vcmpps_avx(auVar48,auVar59,1);
          local_1158 = vblendvps_avx(auVar61,auVar60,auVar48);
          fVar58 = fVar92 * local_1178._0_4_ + local_1158._0_4_ * fVar88 + local_1168._0_4_ * fVar91
          ;
          fVar93 = fVar92 * local_1178._4_4_ + local_1158._4_4_ * fVar88 + local_1168._4_4_ * fVar91
          ;
          fVar69 = fVar92 * local_1178._8_4_ + local_1158._8_4_ * fVar88 + local_1168._8_4_ * fVar91
          ;
          fVar88 = fVar92 * local_1178._12_4_ +
                   local_1158._12_4_ * fVar88 + local_1168._12_4_ * fVar91;
          auVar68._0_4_ = fVar58 + fVar58;
          auVar68._4_4_ = fVar93 + fVar93;
          auVar68._8_4_ = fVar69 + fVar69;
          auVar68._12_4_ = fVar88 + fVar88;
          fVar70 = local_1178._0_4_ * fVar83 + local_1158._0_4_ * fVar70 + local_1168._0_4_ * fVar13
          ;
          fVar83 = local_1178._4_4_ * fVar14 + local_1158._4_4_ * fVar87 + local_1168._4_4_ * fVar85
          ;
          fVar85 = local_1178._8_4_ * fVar17 + local_1158._8_4_ * fVar16 + local_1168._8_4_ * fVar15
          ;
          fVar87 = local_1178._12_4_ * fVar20 +
                   local_1158._12_4_ * fVar19 + local_1168._12_4_ * fVar18;
          auVar48 = vrcpps_avx(auVar68);
          fVar88 = auVar48._0_4_;
          auVar117._0_4_ = auVar68._0_4_ * fVar88;
          fVar91 = auVar48._4_4_;
          auVar117._4_4_ = auVar68._4_4_ * fVar91;
          fVar92 = auVar48._8_4_;
          auVar117._8_4_ = auVar68._8_4_ * fVar92;
          fVar13 = auVar48._12_4_;
          auVar117._12_4_ = auVar68._12_4_ * fVar13;
          auVar126._8_4_ = 0x3f800000;
          auVar126._0_8_ = &DAT_3f8000003f800000;
          auVar126._12_4_ = 0x3f800000;
          auVar48 = vsubps_avx(auVar126,auVar117);
          local_1188._0_4_ = (fVar70 + fVar70) * (fVar88 + fVar88 * auVar48._0_4_);
          local_1188._4_4_ = (fVar83 + fVar83) * (fVar91 + fVar91 * auVar48._4_4_);
          local_1188._8_4_ = (fVar85 + fVar85) * (fVar92 + fVar92 * auVar48._8_4_);
          local_1188._12_4_ = (fVar87 + fVar87) * (fVar13 + fVar13 * auVar48._12_4_);
          auVar47 = ZEXT1664(local_1188);
          uVar32 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar79._4_4_ = uVar32;
          auVar79._0_4_ = uVar32;
          auVar79._8_4_ = uVar32;
          auVar79._12_4_ = uVar32;
          auVar48 = vcmpps_avx(auVar79,local_1188,2);
          uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar100._4_4_ = uVar32;
          auVar100._0_4_ = uVar32;
          auVar100._8_4_ = uVar32;
          auVar100._12_4_ = uVar32;
          auVar59 = vcmpps_avx(local_1188,auVar100,2);
          auVar48 = vandps_avx(auVar59,auVar48);
          auVar59 = auVar49 & auVar48;
          if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar59[0xf] < '\0') {
            auVar49 = vandps_avx(auVar49,auVar48);
            auVar48 = vcmpps_avx(auVar68,_DAT_01feba10,4);
            auVar59 = auVar48 & auVar49;
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              valid.field_0 =
                   (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar49,auVar48);
              tNear.field_0 = local_1098;
              auVar49 = vrcpps_avx(auVar149);
              fVar88 = auVar49._0_4_;
              auVar51._0_4_ = auVar149._0_4_ * fVar88;
              fVar91 = auVar49._4_4_;
              auVar51._4_4_ = auVar149._4_4_ * fVar91;
              fVar92 = auVar49._8_4_;
              auVar51._8_4_ = auVar149._8_4_ * fVar92;
              fVar13 = auVar49._12_4_;
              auVar51._12_4_ = auVar149._12_4_ * fVar13;
              auVar80._8_4_ = 0x3f800000;
              auVar80._0_8_ = &DAT_3f8000003f800000;
              auVar80._12_4_ = 0x3f800000;
              auVar49 = vsubps_avx(auVar80,auVar51);
              auVar43._0_4_ = fVar88 + fVar88 * auVar49._0_4_;
              auVar43._4_4_ = fVar91 + fVar91 * auVar49._4_4_;
              auVar43._8_4_ = fVar92 + fVar92 * auVar49._8_4_;
              auVar43._12_4_ = fVar13 + fVar13 * auVar49._12_4_;
              auVar52._8_4_ = 0x219392ef;
              auVar52._0_8_ = 0x219392ef219392ef;
              auVar52._12_4_ = 0x219392ef;
              auVar49 = vcmpps_avx(local_10b8,auVar52,5);
              auVar49 = vandps_avx(auVar49,auVar43);
              auVar53._0_4_ = local_1098._0_4_ * auVar49._0_4_;
              auVar53._4_4_ = local_1098._4_4_ * auVar49._4_4_;
              auVar53._8_4_ = local_1098._8_4_ * auVar49._8_4_;
              auVar53._12_4_ = local_1098._12_4_ * auVar49._12_4_;
              local_11a8 = vminps_avx(auVar53,auVar80);
              auVar44._0_4_ = local_10a8._0_4_ * auVar49._0_4_;
              auVar44._4_4_ = local_10a8._4_4_ * auVar49._4_4_;
              auVar44._8_4_ = local_10a8._8_4_ * auVar49._8_4_;
              auVar44._12_4_ = local_10a8._12_4_ * auVar49._12_4_;
              local_1198 = vminps_avx(auVar44,auVar80);
              auVar54._8_4_ = 0x7f800000;
              auVar54._0_8_ = 0x7f8000007f800000;
              auVar54._12_4_ = 0x7f800000;
              auVar49 = vblendvps_avx(auVar54,local_1188,(undefined1  [16])valid.field_0);
              auVar48 = vshufps_avx(auVar49,auVar49,0xb1);
              auVar48 = vminps_avx(auVar48,auVar49);
              auVar59 = vshufpd_avx(auVar48,auVar48,1);
              auVar48 = vminps_avx(auVar59,auVar48);
              auVar48 = vcmpps_avx(auVar49,auVar48,0);
              auVar59 = (undefined1  [16])valid.field_0 & auVar48;
              auVar49 = vpcmpeqd_avx(auVar49,auVar49);
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                auVar49 = auVar48;
              }
              auVar49 = vandps_avx((undefined1  [16])valid.field_0,auVar49);
              uVar32 = vmovmskps_avx(auVar49);
              uVar34 = CONCAT44((int)((ulong)&mapUV >> 0x20),uVar32);
              lVar30 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
LAB_0034b606:
              uVar4 = *(uint *)((long)&local_1018 + lVar30 * 4);
              pRVar31 = (RTCRayN *)(ulong)uVar4;
              pGVar12 = (pSVar6->geometries).items[(long)pRVar31].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar30] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar32 = *(undefined4 *)(local_11a8 + lVar30 * 4);
                  uVar2 = *(undefined4 *)(local_1198 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1188 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1178 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1168 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1158 + lVar30 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar32;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_1208 + lVar30 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar4;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_0034ba50;
                }
                uVar32 = *(undefined4 *)(local_11a8 + lVar30 * 4);
                local_fd8._4_4_ = uVar32;
                local_fd8._0_4_ = uVar32;
                local_fd8._8_4_ = uVar32;
                local_fd8._12_4_ = uVar32;
                uVar32 = *(undefined4 *)(local_1198 + lVar30 * 4);
                auVar55._4_4_ = uVar32;
                auVar55._0_4_ = uVar32;
                auVar55._8_4_ = uVar32;
                auVar55._12_4_ = uVar32;
                local_fa8 = vpshufd_avx(ZEXT416(uVar4),0);
                uVar32 = *(undefined4 *)((long)&local_1208 + lVar30 * 4);
                auVar81._4_4_ = uVar32;
                auVar81._0_4_ = uVar32;
                auVar81._8_4_ = uVar32;
                auVar81._12_4_ = uVar32;
                uVar32 = *(undefined4 *)(local_1178 + lVar30 * 4);
                uVar2 = *(undefined4 *)(local_1168 + lVar30 * 4);
                local_ff8._4_4_ = uVar2;
                local_ff8._0_4_ = uVar2;
                local_ff8._8_4_ = uVar2;
                local_ff8._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1158 + lVar30 * 4);
                local_fe8._4_4_ = uVar2;
                local_fe8._0_4_ = uVar2;
                local_fe8._8_4_ = uVar2;
                local_fe8._12_4_ = uVar2;
                local_1008[0] = (RTCHitN)(char)uVar32;
                local_1008[1] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[2] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[3] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[4] = (RTCHitN)(char)uVar32;
                local_1008[5] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[6] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[7] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[8] = (RTCHitN)(char)uVar32;
                local_1008[9] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[10] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[0xb] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_1008[0xc] = (RTCHitN)(char)uVar32;
                local_1008[0xd] = (RTCHitN)(char)((uint)uVar32 >> 8);
                local_1008[0xe] = (RTCHitN)(char)((uint)uVar32 >> 0x10);
                local_1008[0xf] = (RTCHitN)(char)((uint)uVar32 >> 0x18);
                local_fc8 = auVar55;
                local_fb8 = auVar81;
                vcmpps_avx(ZEXT1632(local_fd8),ZEXT1632(local_fd8),0xf);
                uStack_f94 = context->user->instID[0];
                local_f98 = uStack_f94;
                uStack_f90 = uStack_f94;
                uStack_f8c = uStack_f94;
                uStack_f88 = context->user->instPrimID[0];
                uStack_f84 = uStack_f88;
                uStack_f80 = uStack_f88;
                uStack_f7c = uStack_f88;
                uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1188 + lVar30 * 4);
                local_1278 = *local_1268;
                uStack_1270 = local_1268[1];
                args.valid = (int *)&local_1278;
                args.geometryUserPtr = pGVar12->userPtr;
                args.context = context->user;
                args.hit = local_1008;
                args.N = 4;
                pRVar31 = (RTCRayN *)pGVar12->intersectionFilterN;
                auVar49 = auVar47._0_16_;
                args.ray = (RTCRayN *)ray;
                if (pRVar31 != (RTCRayN *)0x0) {
                  pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                  auVar47._8_56_ = extraout_var;
                  auVar47._0_8_ = extraout_XMM1_Qa;
                  auVar55 = auVar47._0_16_;
                  auVar47 = ZEXT1664(auVar49);
                }
                auVar26._8_8_ = uStack_1270;
                auVar26._0_8_ = local_1278;
                if (auVar26 == (undefined1  [16])0x0) {
                  auVar49 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar48 = vpcmpeqd_avx(auVar55,auVar55);
                  auVar49 = auVar49 ^ auVar48;
                }
                else {
                  pRVar31 = (RTCRayN *)context->args->filter;
                  auVar48 = vpcmpeqd_avx(auVar81,auVar81);
                  if ((pRVar31 != (RTCRayN *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                    auVar47 = ZEXT1664(auVar49);
                    auVar48 = vpcmpeqd_avx(auVar48,auVar48);
                  }
                  auVar27._8_8_ = uStack_1270;
                  auVar27._0_8_ = local_1278;
                  auVar59 = vpcmpeqd_avx(auVar27,_DAT_01feba10);
                  auVar49 = auVar59 ^ auVar48;
                  if (auVar27 != (undefined1  [16])0x0) {
                    auVar59 = auVar59 ^ auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])args.hit);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x10));
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x20));
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x30));
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x40));
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x50));
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x60));
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x70));
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar48;
                    auVar48 = vmaskmovps_avx(auVar59,*(undefined1 (*) [16])(args.hit + 0x80));
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar48;
                    pRVar31 = args.ray;
                  }
                }
                auVar57._8_8_ = 0x100000001;
                auVar57._0_8_ = 0x100000001;
                if ((auVar57 & auVar49) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
                }
                valid.field_0.v[lVar30] = 0.0;
                uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar46._4_4_ = uVar32;
                auVar46._0_4_ = uVar32;
                auVar46._8_4_ = uVar32;
                auVar46._12_4_ = uVar32;
                auVar49 = vcmpps_avx(auVar47._0_16_,auVar46,2);
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vandps_avx(auVar49,(undefined1  [16])valid.field_0);
              }
              if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                    (undefined1  [16])0x0 &&
                   ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                   (undefined1  [16])0x0) &&
                  ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                  (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) goto LAB_0034ba50;
              auVar56._8_4_ = 0x7f800000;
              auVar56._0_8_ = 0x7f8000007f800000;
              auVar56._12_4_ = 0x7f800000;
              auVar49 = vblendvps_avx(auVar56,auVar47._0_16_,(undefined1  [16])valid.field_0);
              auVar48 = vshufps_avx(auVar49,auVar49,0xb1);
              auVar48 = vminps_avx(auVar48,auVar49);
              auVar59 = vshufpd_avx(auVar48,auVar48,1);
              auVar48 = vminps_avx(auVar59,auVar48);
              auVar49 = vcmpps_avx(auVar49,auVar48,0);
              auVar48 = (undefined1  [16])valid.field_0 & auVar49;
              aVar45 = valid.field_0;
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                aVar45.v = (__m128)vandps_avx(auVar49,valid.field_0);
              }
              uVar32 = vmovmskps_avx((undefined1  [16])aVar45);
              uVar34 = CONCAT44((int)((ulong)pRVar31 >> 0x20),uVar32);
              lVar30 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              goto LAB_0034b606;
            }
          }
        }
LAB_0034ba50:
        lVar38 = lVar38 + 1;
      } while (lVar38 != uVar35 - 8);
    }
    uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar47 = ZEXT1664(CONCAT412(uVar32,CONCAT48(uVar32,CONCAT44(uVar32,uVar32))));
    auVar118 = ZEXT1664(local_10c8);
    auVar127 = ZEXT1664(local_10d8);
    auVar134 = ZEXT1664(local_10e8);
    auVar136 = ZEXT1664(local_10f8);
    auVar141 = ZEXT1664(local_1108);
    auVar145 = ZEXT1664(local_1118);
    auVar150 = ZEXT1664(local_1128);
    auVar160 = ZEXT1664(local_1138);
    auVar165 = ZEXT1664(local_1148);
    uVar35 = local_1260;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }